

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O3

ArrayBufferDetachedStateBase * __thiscall
Js::ArrayBuffer::DetachAndGetState(ArrayBuffer *this,bool queueForDelayFree)

{
  ThreadContext *pTVar1;
  RefCountedBuffer *pRVar2;
  int iVar3;
  undefined4 extraout_var;
  ArrayBufferDetachedStateBase *pAVar4;
  undefined4 extraout_var_00;
  BasePtr<Js::ArrayBufferDetachedStateBase> local_28;
  
  iVar3 = (*(this->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x78])
                    (this,this->bufferContent,(ulong)this->bufferLength);
  local_28.ptr = (ArrayBufferDetachedStateBase *)CONCAT44(extraout_var,iVar3);
  Detach(this);
  if (queueForDelayFree) {
    pAVar4 = BasePtr<Js::ArrayBufferDetachedStateBase>::operator->(&local_28);
    if (pAVar4->buffer != (RefCountedBuffer *)0x0) {
      pTVar1 = ((((((this->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.type.
                   ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
               threadContext;
      pAVar4 = BasePtr<Js::ArrayBufferDetachedStateBase>::operator->(&local_28);
      pRVar2 = pAVar4->buffer;
      pAVar4 = BasePtr<Js::ArrayBufferDetachedStateBase>::operator->(&local_28);
      iVar3 = (*(this->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x76])(this,pRVar2,(ulong)pAVar4->bufferLength);
      DelayedFreeArrayBuffer::Push
                (&pTVar1->delayFreeCallback,
                 (ArrayBufferContentForDelayedFreeBase *)CONCAT44(extraout_var_00,iVar3));
    }
  }
  return local_28.ptr;
}

Assistant:

ArrayBufferDetachedStateBase* ArrayBuffer::DetachAndGetState(bool queueForDelayFree/* = true*/)
    {
        // Save the state before detaching
        AutoPtr<ArrayBufferDetachedStateBase> arrayBufferState(this->CreateDetachedState(this->bufferContent, this->bufferLength));
        Detach();

        // Now put this bufferContent to the queue so that we can manage the lifetime of the buffer later.
        if (queueForDelayFree && arrayBufferState->buffer != nullptr)
        {
            DelayedFreeArrayBuffer * local = GetScriptContext()->GetThreadContext()->GetScanStackCallback();
            local->Push(this->CopyBufferContentForDelayedFree(arrayBufferState->buffer, arrayBufferState->bufferLength));
        }

        return arrayBufferState.Detach();
    }